

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_calc_secret
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t blen_local;
  uchar *buf_local;
  size_t *olen_local;
  mbedtls_ecdh_context *ctx_local;
  
  if (ctx == (mbedtls_ecdh_context *)0x0) {
    ctx_local._4_4_ = -0x4f80;
  }
  else {
    ctx_local._4_4_ = mbedtls_ecdh_compute_shared(&ctx->grp,&ctx->z,&ctx->Qp,&ctx->d,f_rng,p_rng);
    if (ctx_local._4_4_ == 0) {
      sVar1 = mbedtls_mpi_size(&ctx->z);
      if (blen < sVar1) {
        ctx_local._4_4_ = -0x4f80;
      }
      else {
        *olen = ((ctx->grp).pbits >> 3) + (long)(int)(uint)(((ctx->grp).pbits & 7) != 0);
        ctx_local._4_4_ = mbedtls_mpi_write_binary(&ctx->z,buf,*olen);
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdh_calc_secret( mbedtls_ecdh_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    int ret;

    if( ctx == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecdh_compute_shared( &ctx->grp, &ctx->z, &ctx->Qp, &ctx->d,
                                     f_rng, p_rng ) ) != 0 )
    {
        return( ret );
    }

    if( mbedtls_mpi_size( &ctx->z ) > blen )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    *olen = ctx->grp.pbits / 8 + ( ( ctx->grp.pbits % 8 ) != 0 );
    return mbedtls_mpi_write_binary( &ctx->z, buf, *olen );
}